

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O1

void cvui::handleMouse(int theEvent,int theX,int theY,int theFlags,void *theData)

{
  int iVar1;
  long lVar2;
  long lVar3;
  undefined1 *puVar4;
  undefined1 uVar5;
  undefined1 *puVar6;
  
  lVar3 = 0;
  do {
    iVar1 = *(int *)((long)&DAT_0011c110 + lVar3);
    if (*(int *)((long)&DAT_0011c11c + lVar3) == theEvent) {
      *(undefined2 *)((long)theData + 0x2a) = 0x101;
      lVar2 = (long)iVar1 * 3;
      puVar4 = (undefined1 *)((long)theData + lVar2 + 0x21);
      uVar5 = 1;
      puVar6 = (undefined1 *)((long)theData + lVar2 + 0x20);
LAB_00109b84:
      *puVar4 = 1;
      puVar6[2] = uVar5;
    }
    else if (*(int *)(&DAT_0011c128 + lVar3) == theEvent) {
      *(undefined1 *)((long)theData + 0x29) = 1;
      *(undefined1 *)((long)theData + 0x2b) = 0;
      puVar4 = (undefined1 *)((long)theData + (long)iVar1 * 3 + 0x20);
      uVar5 = 0;
      puVar6 = puVar4;
      goto LAB_00109b84;
    }
    lVar3 = lVar3 + 4;
    if (lVar3 == 0xc) {
      *(int *)((long)theData + 0x2c) = theX;
      *(int *)((long)theData + 0x30) = theY;
      return;
    }
  } while( true );
}

Assistant:

void handleMouse(int theEvent, int theX, int theY, int theFlags, void* theData) {
	int aButtons[3] = { cvui::LEFT_BUTTON, cvui::MIDDLE_BUTTON, cvui::RIGHT_BUTTON };
	int aEventsDown[3] = { cv::EVENT_LBUTTONDOWN, cv::EVENT_MBUTTONDOWN, cv::EVENT_RBUTTONDOWN };
	int aEventsUp[3] = { cv::EVENT_LBUTTONUP, cv::EVENT_MBUTTONUP, cv::EVENT_RBUTTONUP };

	cvui_context_t *aContext = (cvui_context_t *)theData;

	for (int i = 0; i < 3; i++) {
		int aBtn = aButtons[i];

		if (theEvent == aEventsDown[i]) {
			aContext->mouse.anyButton.justPressed = true;
			aContext->mouse.anyButton.pressed = true;
			aContext->mouse.buttons[aBtn].justPressed = true;
			aContext->mouse.buttons[aBtn].pressed = true;

		} else if (theEvent == aEventsUp[i]) {
			aContext->mouse.anyButton.justReleased = true;
			aContext->mouse.anyButton.pressed = false;
			aContext->mouse.buttons[aBtn].justReleased = true;
			aContext->mouse.buttons[aBtn].pressed = false;
		}
	}

	aContext->mouse.position.x = theX;
	aContext->mouse.position.y = theY;
}